

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O2

float SaturatedAdd<float>(float Min,float Max,float Current,float Modifier)

{
  float fVar1;
  
  fVar1 = Current;
  if (0.0 <= Modifier) {
    if ((Current <= Max) && (fVar1 = Max, Current + Modifier <= Max)) {
      fVar1 = Current + Modifier;
    }
  }
  else if ((Min <= Current) && (fVar1 = Min, Min <= Current + Modifier)) {
    fVar1 = Current + Modifier;
  }
  return fVar1;
}

Assistant:

inline T SaturatedAdd(T Min, T Max, T Current, T Modifier)
{
	if(Modifier < 0)
	{
		if(Current < Min)
			return Current;
		Current += Modifier;
		if(Current < Min)
			Current = Min;
		return Current;
	}
	else
	{
		if(Current > Max)
			return Current;
		Current += Modifier;
		if(Current > Max)
			Current = Max;
		return Current;
	}
}